

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

void __thiscall
helics::CloningFilter::CloningFilter(CloningFilter *this,Federate *ffed,string_view filtName)

{
  CloningFilter *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<helics::FilterOperations> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  Filter::Filter(&this->super_Filter,ffed,filtName,(InterfaceHandle)0x9aac0f00);
  (this->super_Filter).super_Interface._vptr_Interface = (_func_int **)&PTR__Filter_004b6c00;
  if (ffed != (Federate *)0x0) {
    local_38 = 0;
    uStack_30 = 0;
    pCVar1 = Federate::registerCloningFilter
                       (ffed,filtName,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
    (this->super_Filter).super_Interface.handle.hid =
         (pCVar1->super_Filter).super_Interface.handle.hid;
  }
  std::make_shared<helics::CloneFilterOperation>();
  local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_50._M_pi;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Filter::setFilterOperations(&this->super_Filter,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  return;
}

Assistant:

CloningFilter::CloningFilter(Federate* ffed, std::string_view filtName):
    Filter(ffed, filtName, InterfaceHandle())
{
    if (ffed != nullptr) {
        handle = ffed->registerCloningFilter(filtName);
    }
    setFilterOperations(std::make_shared<CloneFilterOperation>());
}